

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<ParamsStream<DataStream&,TransactionSerParams>,transaction_identifier<false>,unsigned_int>
               (ParamsStream<DataStream_&,_TransactionSerParams> *s,
               transaction_identifier<false> *args,uint *args_1)

{
  long lVar1;
  long in_FS_OFFSET;
  ParamsStream<DataStream_&,_TransactionSerParams> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<ParamsStream<DataStream_&,_TransactionSerParams>,_transaction_identifier<false>_>
            (in_stack_ffffffffffffffd8,(transaction_identifier<false> *)0x455df4);
  Serialize<ParamsStream<DataStream&,TransactionSerParams>>(in_stack_ffffffffffffffd8,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}